

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::conditional_expression::conditional_expression
          (conditional_expression *this,source_extend *extend,expression_ptr *cond,
          expression_ptr *lhs,expression_ptr *rhs)

{
  bool bVar1;
  expression_ptr *rhs_local;
  expression_ptr *lhs_local;
  expression_ptr *cond_local;
  source_extend *extend_local;
  conditional_expression *this_local;
  
  expression::syntax_node(&this->super_expression,extend);
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__conditional_expression_00296210;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->cond_,cond);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->lhs_,lhs);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->rhs_,rhs);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->lhs_);
  if (!bVar1) {
    __assert_fail("lhs_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x19b,
                  "mjs::conditional_expression::conditional_expression(const source_extend &, expression_ptr &&, expression_ptr &&, expression_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->rhs_);
  if (!bVar1) {
    __assert_fail("rhs_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x19c,
                  "mjs::conditional_expression::conditional_expression(const source_extend &, expression_ptr &&, expression_ptr &&, expression_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit conditional_expression(const source_extend& extend, expression_ptr&& cond, expression_ptr&& lhs, expression_ptr&& rhs) : expression(extend), cond_(std::move(cond)), lhs_(std::move(lhs)), rhs_(std::move(rhs)) {
        assert(lhs_);
        assert(rhs_);
    }